

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_tagged_string(uchar **p,uchar *start,int tag,char *text,size_t text_len)

{
  size_t len;
  int ret;
  size_t text_len_local;
  char *text_local;
  int tag_local;
  uchar *start_local;
  uchar **p_local;
  
  p_local._4_4_ = mbedtls_asn1_write_raw_buffer(p,start,(uchar *)text,text_len);
  if (-1 < p_local._4_4_) {
    p_local._4_4_ = mbedtls_asn1_write_len_and_tag(p,start,(long)p_local._4_4_,(uchar)tag);
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_tagged_string(unsigned char **p, const unsigned char *start, int tag,
                                     const char *text, size_t text_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start,
                                                            (const unsigned char *) text,
                                                            text_len));

    return mbedtls_asn1_write_len_and_tag(p, start, len, tag);
}